

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::base_widget::generate(base_widget *this,int position,form_context *param_3)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [4];
  int in_stack_ffffffffffffffcc;
  
  if ((*(uint *)&in_RDI[0xf].field_2 >> 4 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      impl::todec_string<int>(in_stack_ffffffffffffffcc);
      std::operator+(in_stack_ffffffffffffff98,in_RDI);
      std::__cxx11::string::operator=((string *)&in_RDI[1]._M_string_length,local_38);
      std::__cxx11::string::~string(local_38);
      std::__cxx11::string::~string(local_58);
    }
    *(uint *)&in_RDI[0xf].field_2 = *(uint *)&in_RDI[0xf].field_2 & 0xffffffef | 0x10;
  }
  return;
}

Assistant:

void base_widget::generate(int position,form_context * /*context*/)
{
	if(is_generation_done_)
		return;
	if(name_.empty()) {
		name_ = "_" + impl::todec_string(position);
	}
	is_generation_done_ = 1;
}